

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.cpp
# Opt level: O0

bool Imath_2_5::anon_unknown_9::normalizeOrThrow<int>(Vec4<int> *v)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  Vec4<int> *in_RDI;
  int i;
  int axis;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_10;
  int local_c;
  
  local_c = -1;
  local_10 = 0;
  do {
    if (3 < local_10) {
      piVar2 = Vec4<int>::operator[](in_RDI,local_c);
      iVar1 = -1;
      if (0 < *piVar2) {
        iVar1 = 1;
      }
      piVar2 = Vec4<int>::operator[](in_RDI,local_c);
      *piVar2 = iVar1;
      return true;
    }
    piVar2 = Vec4<int>::operator[](in_RDI,local_10);
    if (*piVar2 != 0) {
      if (local_c != -1) {
        uVar3 = __cxa_allocate_exception(0x48);
        IntVecNormalizeExc::IntVecNormalizeExc
                  ((IntVecNormalizeExc *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
        __cxa_throw(uVar3,&IntVecNormalizeExc::typeinfo,IntVecNormalizeExc::~IntVecNormalizeExc);
      }
      local_c = local_10;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

bool
normalizeOrThrow(Vec4<T> &v)
{
    int axis = -1;
    for (int i = 0; i < 4; i ++)
    {
        if (v[i] != 0)
        {
            if (axis != -1)
            {
                throw IntVecNormalizeExc ("Cannot normalize an integer "
                                          "vector unless it is parallel "
                                          "to a principal axis");
            }
            axis = i;
        }
    }
    v[axis] = (v[axis] > 0) ? 1 : -1;
    return true;
}